

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void server_pull(int fd)

{
  pointer pbVar1;
  pointer pcVar2;
  int iVar3;
  size_t sVar4;
  undefined8 *puVar5;
  long *plVar6;
  size_type *psVar7;
  undefined1 *puVar8;
  ulong uVar9;
  pointer pbVar10;
  long lVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  server_hashes;
  string dir;
  string client_hash;
  undefined1 local_190 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 *local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  pointer *local_130;
  long local_128;
  pointer local_120 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 *local_f0;
  size_t local_e8;
  undefined1 local_e0 [16];
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,HEAD_abi_cxx11_._M_dataplus._M_p,
             HEAD_abi_cxx11_._M_dataplus._M_p + HEAD_abi_cxx11_._M_string_length);
  fileToMsg(&local_50,(Msg *)&files);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  send(fd,(Msg *)&files,0x7d4,0);
  recv(fd,(Msg *)&files,0x7d4,0x100);
  if ((int)files.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start == 2) {
    return;
  }
  local_f0 = local_e0;
  sVar4 = strlen(&stack0x000003f4);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,&stack0x000003f4,&stack0x000003f4 + sVar4);
  read_all_lines_abi_cxx11_(&local_148,HEAD_abi_cxx11_._M_dataplus._M_p);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,HEAD_abi_cxx11_._M_dataplus._M_p,
             HEAD_abi_cxx11_._M_dataplus._M_p + HEAD_abi_cxx11_._M_string_length);
  fileToMsg(&local_70,(Msg *)&files);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  send(fd,(Msg *)&files,0x7d4,0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,LOG_abi_cxx11_._M_dataplus._M_p,
             LOG_abi_cxx11_._M_dataplus._M_p + LOG_abi_cxx11_._M_string_length);
  fileToMsg(&local_90,(Msg *)&files);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  send(fd,(Msg *)&files,0x7d4,0);
  iVar3 = std::__cxx11::string::compare((char *)&local_f0);
  if (iVar3 == 0) {
    puVar8 = (undefined1 *)0x0;
  }
  else {
    local_150 = local_f0;
    psVar7 = &(local_148.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    lVar11 = 0x100000000;
    while ((local_e8 != *psVar7 ||
           ((local_e8 != 0 &&
            (iVar3 = bcmp(local_150,
                          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (psVar7 + -1))->_M_dataplus)._M_p,local_e8), iVar3 != 0))))) {
      lVar11 = lVar11 + 0x100000000;
      psVar7 = psVar7 + 4;
    }
    puVar8 = (undefined1 *)(lVar11 >> 0x20);
  }
  if (puVar8 < (undefined1 *)
               ((long)local_148.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_148.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    do {
      local_190._0_8_ = local_190 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_190,COMMITS_DIR_abi_cxx11_._M_dataplus._M_p,
                 COMMITS_DIR_abi_cxx11_._M_dataplus._M_p + COMMITS_DIR_abi_cxx11_._M_string_length);
      std::__cxx11::string::append((char *)local_190);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      pcVar2 = local_148.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)puVar8]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar2,
                 pcVar2 + local_148.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(long)puVar8]._M_string_length);
      deleteEndl(&local_d0);
      pbVar10 = (pointer)0xf;
      if ((pointer)local_190._0_8_ != (pointer)(local_190 + 0x10)) {
        pbVar10 = (pointer)local_190._16_8_;
      }
      pbVar1 = (pointer)((long)&((_Alloc_hider *)local_190._8_8_)->_M_p + local_128);
      if (pbVar10 < pbVar1) {
        pbVar10 = (pointer)0xf;
        if (local_130 != local_120) {
          pbVar10 = local_120[0];
        }
        if (pbVar10 < pbVar1) goto LAB_0010cd13;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,local_190._0_8_);
      }
      else {
LAB_0010cd13:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append(local_190,(ulong)local_130);
      }
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      psVar7 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_170.field_2._M_allocated_capacity = *psVar7;
        local_170.field_2._8_8_ = puVar5[3];
      }
      else {
        local_170.field_2._M_allocated_capacity = *psVar7;
        local_170._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_170._M_string_length = puVar5[1];
      *puVar5 = psVar7;
      puVar5[1] = 0;
      *(undefined1 *)psVar7 = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_170);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_110.field_2._M_allocated_capacity = *psVar7;
        local_110.field_2._8_8_ = plVar6[3];
      }
      else {
        local_110.field_2._M_allocated_capacity = *psVar7;
        local_110._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_110._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      if (local_130 != local_120) {
        operator_delete(local_130);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      local_150 = puVar8;
      if ((pointer)local_190._0_8_ != (pointer)(local_190 + 0x10)) {
        operator_delete((void *)local_190._0_8_);
      }
      ls_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_190,local_110._M_dataplus._M_p);
      if (local_190._8_8_ != local_190._0_8_) {
        lVar11 = 0;
        uVar9 = 0;
        do {
          std::operator+(&local_170,&local_110,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((_Alloc_hider *)local_190._0_8_)->_M_p + lVar11));
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,local_170._M_dataplus._M_p,
                     local_170._M_dataplus._M_p + local_170._M_string_length);
          fileToMsg(&local_b0,(Msg *)&files);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          files.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
          send(fd,(Msg *)&files,0x7d4,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p);
          }
          uVar9 = uVar9 + 1;
          lVar11 = lVar11 + 0x20;
        } while (uVar9 < (ulong)((long)(local_190._8_8_ - local_190._0_8_) >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      puVar8 = local_150 + 1;
    } while (puVar8 < (undefined1 *)
                      ((long)local_148.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_148.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 2;
  send(fd,(Msg *)&files,0x7d4,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  return;
}

Assistant:

void server_pull(int fd, Msg msg) {
    fileToMsg(HEAD,msg);
    msg.type = MSG_PULL;
    send(fd,&msg,sizeof(msg),0);
    recv(fd, &msg, sizeof(msg), MSG_WAITALL);
    if(msg.type == MSG_END) return;
    String client_hash = msg.buf2;
    Vector<String> server_hashes = read_all_lines(HEAD.c_str());
    fileToMsg(HEAD,msg);
    msg.type = MSG_PULL;
    send(fd,&msg,sizeof(msg),0);
    fileToMsg(LOG,msg);
    send(fd,&msg,sizeof(msg),0);
    int i = 0;
    if(client_hash != ""){
        while(client_hash != server_hashes[i]){
            i++;
        }
        i++;
    }
    while(i<server_hashes.size()){
        String dir = COMMITS_DIR + "/" + deleteEndl(server_hashes[i]) + "/";
        Vector<String> files = ls(dir.c_str());
        for(int j = 0; j < files.size();j++){
            String file = dir + files[j];
            fileToMsg(file,msg);
            msg.type = MSG_PULL;
            send(fd,&msg,sizeof(msg),0);
        }
        i++;
    }
    msg.type = MSG_END;
    send(fd,&msg,sizeof(msg),0);
}